

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

BinaryenExpressionRef BinaryenRefIsNull(BinaryenModuleRef module,BinaryenExpressionRef value)

{
  RefIsNull *this;
  
  this = (RefIsNull *)MixedArena::allocSpace(&module->allocator,0x18,8);
  (this->super_SpecificExpression<(wasm::Expression::Id)42>).super_Expression._id = RefIsNullId;
  (this->super_SpecificExpression<(wasm::Expression::Id)42>).super_Expression.type.id = 0;
  this->value = value;
  wasm::RefIsNull::finalize(this);
  return (BinaryenExpressionRef)this;
}

Assistant:

BinaryenExpressionRef BinaryenRefIsNull(BinaryenModuleRef module,
                                        BinaryenExpressionRef value) {
  return static_cast<Expression*>(
    Builder(*(Module*)module).makeRefIsNull((Expression*)value));
}